

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effects-info.c
# Opt level: O0

textblock *
create_nested_effect_description
          (effect *e,int count,char *prefix,char *type_prefix,int dev_skill_boost,effect **nexte)

{
  dice_t *pdVar1;
  random_value value;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  char *pcVar5;
  effect *tba;
  effect *peVar6;
  char *local_238;
  int local_224;
  int local_20c;
  int ivalid_1;
  textblock *tb;
  char local_1f8 [4];
  int ivalid;
  char desc [200];
  char local_128 [8];
  char dice_string [20];
  char local_108 [8];
  char breaths [120];
  random_value this_rv;
  int nvalid;
  int jrand;
  int irand;
  _Bool same_dice;
  _Bool same_other;
  int iStack_6c;
  _Bool same_ind;
  random_value first_rv;
  int first_other;
  int first_ind;
  dice_t *first_dice;
  effect *efirst;
  textblock *res;
  effect **nexte_local;
  int dev_skill_boost_local;
  char *type_prefix_local;
  char *prefix_local;
  effect *peStack_18;
  int count_local;
  effect *e_local;
  
  efirst = (effect *)0x0;
  memset(&irand,0,0x10);
  nvalid = 0;
  peStack_18 = e;
  while( true ) {
    peVar6 = peStack_18;
    if ((peStack_18 == (effect *)0x0) || (count <= nvalid)) {
      *nexte = peStack_18;
      return (textblock *)0x0;
    }
    pcVar5 = effect_desc(peStack_18);
    if (((pcVar5 != (char *)0x0) && (peStack_18->index != 1)) && (peStack_18->index != 0x6c)) break;
    peStack_18 = peStack_18->next;
    nvalid = nvalid + 1;
  }
  first_rv.m_bonus = (int)peStack_18->index;
  first_rv.sides = peStack_18->other;
  pdVar1 = peStack_18->dice;
  if (peStack_18->dice != (dice_t *)0x0) {
    dice_random_value(peStack_18->dice,(random_value *)&irand);
  }
  this_rv.sides = 1;
  bVar2 = true;
  bVar4 = true;
  bVar3 = true;
  this_rv.m_bonus = nvalid;
  for (peStack_18 = peStack_18->next; this_rv.m_bonus = this_rv.m_bonus + 1,
      peStack_18 != (effect *)0x0 && this_rv.m_bonus < count; peStack_18 = peStack_18->next) {
    pcVar5 = effect_desc(peStack_18);
    if (((pcVar5 != (char *)0x0) && (peStack_18->index != 1)) && (peStack_18->index != 0x6c)) {
      this_rv.sides = this_rv.sides + 1;
      if ((uint)peStack_18->index != first_rv.m_bonus) {
        bVar2 = false;
      }
      if (peStack_18->other != first_rv.sides) {
        bVar4 = false;
      }
      if (peStack_18->dice == (dice_t *)0x0) {
        if (pdVar1 != (dice_t *)0x0) {
          bVar3 = false;
        }
      }
      else if (pdVar1 == (dice_t *)0x0) {
        bVar3 = false;
      }
      else {
        dice_random_value(peStack_18->dice,(random_value *)(breaths + 0x70));
        if (((breaths._112_4_ != irand) || (breaths._116_4_ != iStack_6c)) ||
           ((this_rv.base != first_rv.base || (this_rv.dice != first_rv.dice)))) {
          bVar3 = false;
        }
      }
    }
  }
  *nexte = peStack_18;
  if ((((bVar2) && (base_descs[first_rv.m_bonus].efinfo_flag == 0xe)) && (bVar3)) && (bVar4)) {
    strnfmt(local_108,0x78,"%s",projections[peVar6->subtype].player_desc);
    tb._4_4_ = 1;
    for (peStack_18 = peVar6->next; this_rv.m_bonus = nvalid + 1,
        peStack_18 != (effect *)0x0 && this_rv.m_bonus < count; peStack_18 = peStack_18->next) {
      pcVar5 = effect_desc(peStack_18);
      if (((pcVar5 != (char *)0x0) && (peStack_18->index != 1)) && (peStack_18->index != 0x6c)) {
        if (tb._4_4_ == this_rv.sides + -1) {
          pcVar5 = " or ";
          if (2 < this_rv.sides) {
            pcVar5 = ", or ";
          }
          my_strcat(local_108,pcVar5,0x78);
        }
        else {
          my_strcat(local_108,", ",0x78);
        }
        my_strcat(local_108,projections[peStack_18->subtype].player_desc,0x78);
        tb._4_4_ = tb._4_4_ + 1;
      }
      nvalid = this_rv.m_bonus;
    }
    format_dice_string((random_value *)&irand,1,0x14,local_128);
    pcVar5 = effect_desc(peVar6);
    strnfmt(local_1f8,200,pcVar5,local_108,(ulong)(uint)peVar6->other,local_128);
    local_224 = dev_skill_boost;
    if (peVar6->index == 0x48) {
      local_224 = 0;
    }
    value.dice = iStack_6c;
    value.base = irand;
    value.sides = first_rv.base;
    value.m_bonus = first_rv.dice;
    append_damage(local_1f8,200,value,local_224);
    efirst = (effect *)textblock_new();
    if (prefix != (char *)0x0) {
      textblock_append((textblock *)efirst,"%s",prefix);
    }
    if (type_prefix != (char *)0x0) {
      textblock_append((textblock *)efirst,"%s",type_prefix);
    }
    copy_to_textblock_with_coloring((textblock *)efirst,local_1f8);
  }
  else {
    tba = (effect *)effect_describe(peVar6,type_prefix,dev_skill_boost,true);
    if (tba == (effect *)0x0) {
      local_20c = 0;
      this_rv.sides = this_rv.sides + -1;
    }
    else {
      local_20c = 1;
      efirst = tba;
      if (prefix != (char *)0x0) {
        efirst = (effect *)textblock_new();
        textblock_append((textblock *)efirst,"%s",prefix);
        textblock_append_textblock((textblock *)efirst,(textblock *)tba);
        textblock_free((textblock *)tba);
      }
    }
    for (peStack_18 = peVar6->next; this_rv.m_bonus = nvalid + 1,
        peStack_18 != (effect *)0x0 && this_rv.m_bonus < count; peStack_18 = peStack_18->next) {
      pcVar5 = effect_desc(peStack_18);
      if (((pcVar5 != (char *)0x0) && (peStack_18->index != 1)) && (peStack_18->index != 0x6c)) {
        local_238 = type_prefix;
        if (local_20c != 0) {
          local_238 = (char *)0x0;
        }
        peVar6 = (effect *)effect_describe(peStack_18,local_238,dev_skill_boost,true);
        if (peVar6 == (effect *)0x0) {
          this_rv.sides = this_rv.sides + -1;
        }
        else {
          if ((prefix != (char *)0x0) && (efirst == (effect *)0x0)) {
            if (local_20c != 0) {
              __assert_fail("ivalid == 0",
                            "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/effects-info.c"
                            ,0x11e,
                            "textblock *create_nested_effect_description(const struct effect *, int, const char *, const char *, int, const struct effect **)"
                           );
            }
            efirst = (effect *)textblock_new();
            textblock_append((textblock *)efirst,"%s",prefix);
          }
          if (efirst != (effect *)0x0) {
            if (0 < local_20c) {
              pcVar5 = ", ";
              if (local_20c == this_rv.sides + -1) {
                pcVar5 = " or ";
              }
              textblock_append((textblock *)efirst,pcVar5);
            }
            textblock_append_textblock((textblock *)efirst,(textblock *)peVar6);
            textblock_free((textblock *)peVar6);
            peVar6 = efirst;
          }
          efirst = peVar6;
          local_20c = local_20c + 1;
        }
      }
      nvalid = this_rv.m_bonus;
    }
  }
  return (textblock *)efirst;
}

Assistant:

static textblock *create_nested_effect_description(const struct effect *e,
	int count, const char *prefix, const char *type_prefix,
	int dev_skill_boost, const struct effect **nexte)
{
	/*
	 * Do one pass through the effects to determine if they are of all the
	 * the same basic type.  That is used to condense the description in
	 * the case where all are breaths.  Ignore random nested effects since
	 * they will do nothing when the outer random effect is processed with
	 * effect_do().
	 */
	textblock *res = NULL;
	const struct effect *efirst;
	const dice_t *first_dice;
	int first_ind, first_other;
	random_value first_rv = { 0, 0, 0, 0 };
	bool same_ind, same_other, same_dice;
	int irand, jrand;
	int nvalid;

	/* Find the first effect that's valid and not random nor select. */
	irand = 0;
	while (1) {
		if (!e || irand >= count) {
			/*
			 * There's no valid or non-random effects; do nothing.
			 */
			*nexte = e;
			return false;
		}
		if (effect_desc(e) && e->index != EF_RANDOM &&
				e->index != EF_SELECT) {
			break;
		}
		e = e->next;
		++irand;
	}

	efirst = e;
	first_ind = e->index;
	first_other = e->other;
	first_dice = e->dice;
	if (e->dice) {
		dice_random_value(e->dice, &first_rv);
	}

	nvalid = 1;
	same_ind = true;
	same_other = true;
	same_dice = true;
	for (e = efirst->next, jrand = irand + 1;
		e && jrand < count;
		e = e->next, ++jrand) {
		if (!effect_desc(e) || e->index == EF_RANDOM ||
				e->index == EF_SELECT) {
			continue;
		}
		++nvalid;
		if (e->index != first_ind) {
			same_ind = false;
		}
		if (e->other != first_other) {
			same_other = false;
		}
		if (e->dice) {
			if (first_dice) {
				random_value this_rv;

				dice_random_value(e->dice, &this_rv);
				if (this_rv.base != first_rv.base ||
					this_rv.dice != first_rv.dice ||
					this_rv.sides != first_rv.sides ||
					this_rv.m_bonus != first_rv.m_bonus) {
					same_dice = false;
				}
			} else {
				same_dice = false;
			}
		} else if (first_dice) {
			same_dice = false;
		}
	}
	*nexte = e;

	if (same_ind && base_descs[first_ind].efinfo_flag == EFINFO_BREATH &&
		same_dice && same_other) {
		/* Concatenate the list of possible elements. */
		char breaths[120], dice_string[20], desc[200];
		int ivalid;

		strnfmt(breaths, sizeof(breaths), "%s",
			projections[efirst->subtype].player_desc);
		ivalid = 1;
		for (e = efirst->next, jrand = irand + 1;
			e && jrand < count;
			e = e->next, ++jrand) {
			if (!effect_desc(e) || e->index == EF_RANDOM ||
					e->index == EF_SELECT) {
				continue;
			}
			if (ivalid == nvalid - 1) {
				my_strcat(breaths,
					(nvalid > 2) ? ", or " : " or ",
					sizeof(breaths));
			} else {
				my_strcat(breaths, ", ", sizeof(breaths));
			}
			my_strcat(breaths, projections[e->subtype].player_desc,
				sizeof(breaths));
			++ivalid;
		}

		/* Then use that in the effect description. */
		format_dice_string(&first_rv, 1, sizeof(dice_string),
			dice_string);
		strnfmt(desc, sizeof(desc), effect_desc(efirst), breaths,
			efirst->other, dice_string);
		append_damage(desc, sizeof(desc), first_rv,
			efirst->index == EF_BREATH ? 0 : dev_skill_boost);

		res = textblock_new();
		if (prefix) {
			textblock_append(res, "%s", prefix);
		}
		if (type_prefix) {
			textblock_append(res, "%s", type_prefix);
		}
		copy_to_textblock_with_coloring(res, desc);
	} else {
		/* Concatenate the effect descriptions. */
		textblock *tb;
		int ivalid;
		
		tb = effect_describe(efirst, type_prefix, dev_skill_boost,
			true);
		if (tb) {
			ivalid = 1;
			if (prefix) {
				res = textblock_new();
				textblock_append(res, "%s", prefix);
				textblock_append_textblock(res, tb);
				textblock_free(tb);
			} else {
				res = tb;
			}
		} else {
			ivalid = 0;
			--nvalid;
		}
		for (e = efirst->next, jrand = irand + 1;
			e && jrand < count;
			e = e->next, ++jrand) {
			if (!effect_desc(e) || e->index == EF_RANDOM ||
					e->index == EF_SELECT) {
				continue;
			}
			tb = effect_describe(e,
				(ivalid == 0) ? type_prefix : NULL,
				dev_skill_boost, true);
			if (!tb) {
				--nvalid;
				continue;
			}
			if (prefix && ! res) {
				assert(ivalid == 0);
				res = textblock_new();
				textblock_append(res, "%s", prefix);
			}
			if (res) {
				if (ivalid > 0) {
					textblock_append(res,
						(ivalid == nvalid - 1) ?
						" or " : ", ");
				}
				textblock_append_textblock(res, tb);
				textblock_free(tb);
			} else {
				res = tb;
			}
			++ivalid;
		}
	}

	return res;
}